

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

bool __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  semantic_tag sVar1;
  uint uVar2;
  
  while( true ) {
    uVar2 = (byte)(this->field_0).json_const_pointer_ & 0xf;
    if (0xf < uVar2) {
      return false;
    }
    if ((0x300U >> uVar2 & 1) == 0) break;
    this = *(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> **)
            ((long)&this->field_0 + 8);
  }
  if ((0x6cU >> uVar2 & 1) != 0) {
    return true;
  }
  if ((0x8080U >> uVar2 & 1) == 0) {
    return false;
  }
  sVar1 = tag(this);
  if (sVar1 != bigint) {
    sVar1 = tag(this);
    if (sVar1 != bigdec) {
      sVar1 = tag(this);
      return sVar1 == bigfloat;
    }
    return true;
  }
  return true;
}

Assistant:

bool is_number() const noexcept
        {
            switch (storage_kind())
            {
                case json_storage_kind::int64:
                case json_storage_kind::uint64:
                case json_storage_kind::half_float:
                case json_storage_kind::float64:
                    return true;
                case json_storage_kind::short_str:
                case json_storage_kind::long_str:
                    return tag() == semantic_tag::bigint ||
                           tag() == semantic_tag::bigdec ||
                           tag() == semantic_tag::bigfloat;
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().is_number();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().is_number();
                default:
                    return false;
            }
        }